

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void initialize_node_type(void)

{
  mapped_type *pmVar1;
  allocator local_29;
  key_type local_28;
  
  std::__cxx11::string::string((string *)&local_28,"access",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x102;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"allow",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x104;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"alternate",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x105;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"and",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1ea;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"any",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x106;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"append",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x107;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"as",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x108;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"ascending",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x109;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"back",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x10a;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"bel",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"block",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x10b;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"blocksize",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x10c;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"bs",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"bucketsize",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x10d;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"buffer",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x10e;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"by",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x10f;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"byte",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x110;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"call",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x111;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"cause",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x113;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"case",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x112;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"chain",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x114;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"change",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x115;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"changes",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x118;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"close",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x119;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"clustersize",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x11a;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"com",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x11b;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"common",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x11b;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"con",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x11c;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"connect",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x120;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"constant",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x11d;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"contiguous",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x11e;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"continue",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x11f;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"count",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x121;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"cr",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"data",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x122;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"decimal",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x123;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"declare",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x124;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"def",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x125;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"defaultname",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x127;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"del",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"delete",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x128;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"desc",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x129;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"descending",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x12a;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"dim",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 299;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"dimension",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 299;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"double",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 300;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"duplicates",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x12d;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"else",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x12e;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"end",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x12f;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"eq",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x130;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"eqv",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1e8;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"error",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x132;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"esc",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"exit",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x133;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"explicit",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x134;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"extend",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x135;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"extendsize",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x136;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"external",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x137;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"explicit",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x134;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"ff",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"field",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x138;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"file",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x139;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"filesize",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x13a;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"find",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x13b;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"fixed",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x13c;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"fnend",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x13d;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"fnexit",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x13e;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"for",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x13f;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"fortran",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x140;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"free",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x141;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"from",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x142;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"function",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x143;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"functionend",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x145;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"functionexit",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x146;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"ge",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x147;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"get",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x148;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"gfloat",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x149;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"sfloat",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x149;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"tfloat",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x149;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"xfloat",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x149;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"dfloat",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x149;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"go",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x14a;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"gosub",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x14b;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"goto",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x14c;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"gt",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x14d;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"handler",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x14e;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"hfloat",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x14f;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"ht",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"idn",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x150;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"if",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x151;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"imp",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1ec;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"in",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x152;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"inv",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x154;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"indexed",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x155;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"input",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x156;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"integer",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x157;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"iterate",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x158;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"key",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x159;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"kill",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x15a;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"let",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x15b;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"lf",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"line",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x15c;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"linput",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x15d;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"list",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x15e;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"long",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x15f;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"basic$quadword",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x15f;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"quad",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x15f;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"lset",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x160;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"map",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x161;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"margin",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x162;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"mat",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x163;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"mod",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x165;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"mode",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x166;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"modify",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x167;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"move",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x168;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"name",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x169;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"next",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x16a;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"nochanges",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x16c;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"no",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x16b;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"noduplicates",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x16d;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"none",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x16f;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"nospan",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x171;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"not",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1ee;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"nx",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x14d;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"nxeq",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x147;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"on",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x172;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"onerror",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1f9;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"open",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x173;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"option",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x174;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"or",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1eb;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"otherwise",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x176;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"output",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x177;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"organization",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x175;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"pi",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"primary",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x179;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"print",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x17a;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"program",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x17c;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"prompt",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x17b;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"put",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x17f;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"read",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x181;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"real",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x182;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"record",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x183;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"recordtype",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x184;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"recordsize",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x185;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"ref",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x186;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"regardless",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x187;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"relative",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x188;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"reset",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x18c;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"restore",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x18b;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"resume",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x18d;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"return",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 399;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"retry",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x18e;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"rfa",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x191;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"rset",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x193;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"scale",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x194;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"scratch",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x195;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"select",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x196;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"sequential",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x197;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"set",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x198;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"si",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"single",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x199;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"size",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x19a;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"sleep",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x19b;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"so",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"sp",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"span",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x19c;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"step",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x19d;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"stop",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x19e;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"stream",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x19f;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"string",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1a0;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"sub",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1a1;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"subend",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1a2;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"subexit",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1a3;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"temporary",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1a5;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"then",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1a6;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"to",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1a7;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"trn",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1a8;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"type",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1a9;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"undefined",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1aa;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"unless",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1ab;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"unlock",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1ac;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"until",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1ad;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"update",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1ae;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"use",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1af;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"using",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1b1;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"value",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1b2;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"variable",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1b3;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"variant",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1b4;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"virtual",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1b5;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"vt",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1d6;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"wait",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1b6;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"when",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1b7;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"while",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1b8;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"windowsize",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1b9;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"word",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1ba;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"write",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1bb;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"xor",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1ed;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"zer",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&node_type_abi_cxx11_,&local_28);
  *pmVar1 = 0x1bc;
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

static void initialize_node_type(void)
{
	node_type["access"] = BAS_S_ACCESS;
	node_type["allow"] = BAS_S_ALLOW;
	node_type["alternate"] = BAS_S_ALTERNATE;
	node_type["and"] = BAS_S_AND;
	node_type["any"] = BAS_S_ANY;
	node_type["append"] = BAS_S_APPEND;
	node_type["as"] = BAS_S_AS;
	node_type["ascending"] = BAS_S_ASCENDING;
	node_type["back"] = BAS_S_BACK;
	node_type["bel"] = BAS_V_PREDEF;
	node_type["block"] = BAS_S_BLOCK;
	node_type["blocksize"] = BAS_S_BLOCKSIZE;
	node_type["bs"] = BAS_V_PREDEF;
	node_type["bucketsize"] = BAS_S_BUCKETSIZE;
	node_type["buffer"] = BAS_S_BUFFER;
	node_type["by"] = BAS_S_BY;
	node_type["byte"] = BAS_S_BYTE;
	node_type["call"] = BAS_S_CALL;
	node_type["cause"] = BAS_S_CAUSE;
	node_type["case"] = BAS_S_CASE;
	node_type["chain"] = BAS_S_CHAIN;
	node_type["change"] = BAS_S_CHANGE;
	node_type["changes"] = BAS_S_CHANGES;
	node_type["close"] = BAS_S_CLOSE;
	node_type["clustersize"] = BAS_S_CLUSTERSIZE;
	node_type["com"] = BAS_S_COMMON;
	node_type["common"] = BAS_S_COMMON;
	node_type["con"] = BAS_S_CON;
	node_type["connect"] = BAS_S_CONNECT;
	node_type["constant"] = BAS_S_CONSTANT;
	node_type["contiguous"] = BAS_S_CONTIGUOUS;
	node_type["continue"] = BAS_S_CONTINUE;
	node_type["count"] = BAS_S_COUNT;
	node_type["cr"] = BAS_V_PREDEF;
	node_type["data"] = BAS_S_DATA;
	node_type["decimal"] = BAS_S_DECIMAL;
	node_type["declare"] = BAS_S_DECLARE;
	node_type["def"] = BAS_S_DEF;
	node_type["defaultname"] = BAS_S_DEFAULTNAME;
	node_type["del"] = BAS_V_PREDEF;
	node_type["delete"] = BAS_S_DELETE;
	node_type["desc"] = BAS_S_DESC;
	node_type["descending"] = BAS_S_DESCENDING;
	node_type["dim"] = BAS_S_DIM;
	node_type["dimension"] = BAS_S_DIM;
	node_type["double"] = BAS_S_DOUBLE;
	node_type["duplicates"] = BAS_S_DUPLICATES;
	node_type["else"] = BAS_S_ELSE;
	node_type["end"] = BAS_S_END;
	node_type["eq"] = BAS_S_EQ;
	node_type["eqv"] = BAS_S_EQV;
	node_type["error"] = BAS_S_ERROR;
	node_type["esc"] = BAS_V_PREDEF;
	node_type["exit"] = BAS_S_EXIT;
	node_type["explicit"] = BAS_S_EXPLICIT;
	node_type["extend"] = BAS_S_EXTEND;
	node_type["extendsize"] = BAS_S_EXTENDSIZE;
	node_type["external"] = BAS_S_EXTERNAL;
	node_type["explicit"] = BAS_S_EXPLICIT;
	node_type["ff"] = BAS_V_PREDEF;
	node_type["field"] = BAS_S_FIELD;
	node_type["file"] = BAS_S_FILE;
	node_type["filesize"] = BAS_S_FILESIZE;
	node_type["find"] = BAS_S_FIND;
	node_type["fixed"] = BAS_S_FIXED;
	node_type["fnend"] = BAS_S_FNEND;
	node_type["fnexit"] = BAS_S_FNEXIT;
	node_type["for"] = BAS_S_FOR;
	node_type["fortran"] = BAS_S_FORTRAN;
	node_type["free"] = BAS_S_FREE;
	node_type["from"] = BAS_S_FROM;
	node_type["function"] = BAS_S_FUNCTION;
	node_type["functionend"] = BAS_S_FUNCTIONEND;
	node_type["functionexit"] = BAS_S_FUNCTIONEXIT;
	node_type["ge"] = BAS_S_GE;
	node_type["get"] = BAS_S_GET;
	node_type["gfloat"] = BAS_S_GFLOAT;
	node_type["sfloat"] = BAS_S_GFLOAT;
	node_type["tfloat"] = BAS_S_GFLOAT;
	node_type["xfloat"] = BAS_S_GFLOAT;
	node_type["dfloat"] = BAS_S_GFLOAT;
	node_type["go"] = BAS_S_GO;
	node_type["gosub"] = BAS_S_GOSUB;
	node_type["goto"] = BAS_S_GOTO;
	node_type["gt"] = BAS_S_GT;
	node_type["handler"] = BAS_S_HANDLER;
	node_type["hfloat"] = BAS_S_HFLOAT;
	node_type["ht"] = BAS_V_PREDEF;
	node_type["idn"] = BAS_S_IDN;
	node_type["if"] = BAS_S_IF;
	node_type["imp"] = BAS_S_IMP;
	node_type["in"] = BAS_S_IN;
	node_type["inv"] = BAS_S_INV;
	node_type["indexed"] = BAS_S_INDEXED;
	node_type["input"] = BAS_S_INPUT;
	node_type["integer"] = BAS_S_INTEGER;
	node_type["iterate"] = BAS_S_ITERATE;
	node_type["key"] = BAS_S_KEY;
	node_type["kill"] = BAS_S_KILL;
	node_type["let"] = BAS_S_LET;
	node_type["lf"] = BAS_V_PREDEF;
	node_type["line"] = BAS_S_LINE;
	node_type["linput"] = BAS_S_LINPUT;
	node_type["list"] = BAS_S_LIST;
	node_type["long"] = BAS_S_LONG;
	node_type["basic$quadword"] = BAS_S_LONG;
	node_type["quad"] = BAS_S_LONG;
	node_type["lset"] = BAS_S_LSET;
	node_type["map"] = BAS_S_MAP;
	node_type["margin"] = BAS_S_MARGIN;
	node_type["mat"] = BAS_S_MAT;
	node_type["mod"] = BAS_S_MOD;
	node_type["mode"] = BAS_S_MODE;
	node_type["modify"] = BAS_S_MODIFY;
	node_type["move"] = BAS_S_MOVE;
	node_type["name"] = BAS_S_NAME;
	node_type["next"] = BAS_S_NEXT;
	node_type["nochanges"] = BAS_S_NOCHANGES;
	node_type["no"] = BAS_S_NO;
	node_type["noduplicates"] = BAS_S_NODUPLICATES;
	node_type["none"] = BAS_S_NONE;
	node_type["nospan"] = BAS_S_NOSPAN;
	node_type["not"] = BAS_S_NOT;
	node_type["nx"] = BAS_S_GT;
	node_type["nxeq"] = BAS_S_GE;
	node_type["on"] = BAS_S_ON;
	node_type["onerror"] = BAS_N_ONERROR;
	node_type["open"] = BAS_S_OPEN;
	node_type["option"] = BAS_S_OPTION;
	node_type["or"] = BAS_S_OR;
	node_type["otherwise"] = BAS_S_OTHERWISE;
	node_type["output"] = BAS_S_OUTPUT;
	node_type["organization"] = BAS_S_ORGANIZATION;
	node_type["pi"] = BAS_V_PREDEF;
	node_type["primary"] = BAS_S_PRIMARY;
	node_type["print"] = BAS_S_PRINT;
	node_type["program"] = BAS_S_PROGRAM;
	node_type["prompt"] = BAS_S_PROMPT;
	node_type["put"] = BAS_S_PUT;
	node_type["read"] = BAS_S_READ;
	node_type["real"] = BAS_S_REAL;
	node_type["record"] = BAS_S_RECORD;
	node_type["recordtype"] = BAS_S_RECORDTYPE;
	node_type["recordsize"] = BAS_S_RECORDSIZE;
	node_type["ref"] = BAS_S_REF;
	node_type["regardless"] = BAS_S_REGARDLESS;
	node_type["relative"] = BAS_S_RELATIVE;
	node_type["reset"] = BAS_S_RESET;
	node_type["restore"] = BAS_S_RESTORE;
	node_type["resume"] = BAS_S_RESUME;
	node_type["return"] = BAS_S_RETURN;
	node_type["retry"] = BAS_S_RETRY;
	node_type["rfa"] = BAS_S_RFA;
	node_type["rset"] = BAS_S_RSET;
	node_type["scale"] = BAS_S_SCALE;
	node_type["scratch"] = BAS_S_SCRATCH;
	node_type["select"] = BAS_S_SELECT;
	node_type["sequential"] = BAS_S_SEQUENTIAL;
	node_type["set"] = BAS_S_SET;
	node_type["si"] = BAS_V_PREDEF;
	node_type["single"] = BAS_S_SINGLE;
	node_type["size"] = BAS_S_SIZE;
	node_type["sleep"] = BAS_S_SLEEP;
	node_type["so"] = BAS_V_PREDEF;
	node_type["sp"] = BAS_V_PREDEF;
	node_type["span"] = BAS_S_SPAN;
	node_type["step"] = BAS_S_STEP;
	node_type["stop"] = BAS_S_STOP;
	node_type["stream"] = BAS_S_STREAM;
	node_type["string"] = BAS_S_STRING;
	node_type["sub"] = BAS_S_SUB;
	node_type["subend"] = BAS_S_SUBEND;
	node_type["subexit"] = BAS_S_SUBEXIT;
	node_type["temporary"] = BAS_S_TEMPORARY;
	node_type["then"] = BAS_S_THEN;
	node_type["to"] = BAS_S_TO;
	node_type["trn"] = BAS_S_TRN;
	node_type["type"] = BAS_S_TYPE;
	node_type["undefined"] = BAS_S_UNDEFINED;
	node_type["unless"] = BAS_S_UNLESS;
	node_type["unlock"] = BAS_S_UNLOCK;
	node_type["until"] = BAS_S_UNTIL;
	node_type["update"] = BAS_S_UPDATE;
	node_type["use"] = BAS_S_USE;
	node_type["using"] = BAS_S_USING;
	node_type["value"] = BAS_S_VALUE;
	node_type["variable"] = BAS_S_VARIABLE;
	node_type["variant"] = BAS_S_VARIANT;
	node_type["virtual"] = BAS_S_VIRTUAL;
	node_type["vt"] = BAS_V_PREDEF;
	node_type["wait"] = BAS_S_WAIT;
	node_type["when"] = BAS_S_WHEN;
	node_type["while"] = BAS_S_WHILE;
	node_type["windowsize"] = BAS_S_WINDOWSIZE;
	node_type["word"] = BAS_S_WORD;
	node_type["write"] = BAS_S_WRITE;
	node_type["xor"] = BAS_S_XOR;
	node_type["zer"] = BAS_S_ZER;
}